

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O0

CURLcode Curl_xfer_write_resp_hd(Curl_easy *data,char *hd0,size_t hdlen,_Bool is_eos)

{
  _Bool is_eos_local;
  size_t hdlen_local;
  char *hd0_local;
  Curl_easy *data_local;
  
  if (data->conn->handler->write_resp_hd ==
      (_func_CURLcode_Curl_easy_ptr_char_ptr_size_t__Bool *)0x0) {
    data_local._4_4_ = Curl_xfer_write_resp(data,hd0,hdlen,is_eos);
  }
  else {
    data_local._4_4_ = (*data->conn->handler->write_resp_hd)(data,hd0,hdlen,is_eos);
  }
  return data_local._4_4_;
}

Assistant:

CURLcode Curl_xfer_write_resp_hd(struct Curl_easy *data,
                                 const char *hd0, size_t hdlen, bool is_eos)
{
  if(data->conn->handler->write_resp_hd) {
    /* protocol handlers offering this function take full responsibility
     * for writing all received download data to the client. */
    return data->conn->handler->write_resp_hd(data, hd0, hdlen, is_eos);
  }
  /* No special handling by protocol handler, write as response bytes */
  return Curl_xfer_write_resp(data, hd0, hdlen, is_eos);
}